

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int *piVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  uint uVar20;
  void *pvVar21;
  void *pvVar22;
  undefined4 *puVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  undefined8 *puVar27;
  undefined1 (*pauVar28) [32];
  int nn;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  undefined8 *puVar31;
  undefined1 (*pauVar32) [32];
  undefined4 *puVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  undefined4 *puVar38;
  ulong uVar39;
  undefined4 *puVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 local_128 [64];
  size_t local_e8;
  Mat *local_d8;
  Mat *local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  void *local_a8;
  ulong local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  uVar2 = bottom_im2col->w;
  uVar39 = (ulong)(int)uVar2;
  iVar24 = bottom_im2col->h;
  uVar17 = bottom_im2col->c;
  uVar19 = (ulong)uVar17;
  local_c8 = (ulong)top_blob->c;
  local_e8 = 0;
  local_128._0_8_ = (void *)0x0;
  local_128._8_4_ = 0;
  local_128._12_4_ = 0;
  local_128._16_8_ = 0;
  local_128._24_4_ = 0;
  local_128._32_8_ = (Allocator *)0x0;
  local_128._40_4_ = 0;
  local_128._44_4_ = 0;
  local_128._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar39 < 4) {
    uVar15 = uVar2;
    iVar34 = iVar24;
    if (1 < (int)uVar2) {
      iVar34 = iVar24 * 2;
      uVar15 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar15 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar34 = iVar24 * 4;
  }
  local_d8 = top_blob;
  local_d0 = kernel;
  Mat::create((Mat *)local_128,iVar34,uVar17,uVar15,8,8,opt->workspace_allocator);
  uVar15 = (int)uVar2 >> 2;
  if (0 < (int)uVar15) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      if (0 < (int)uVar17) {
        pauVar28 = (undefined1 (*) [32])(local_e8 * uVar26 * local_128._16_8_ + local_128._0_8_);
        uVar29 = 0;
        do {
          if (0 < iVar24) {
            pauVar32 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + lVar25);
            iVar34 = iVar24;
            do {
              *pauVar28 = *pauVar32;
              pauVar28 = pauVar28 + 1;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + (ulong)uVar2 * 8);
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar19);
      }
      uVar26 = uVar26 + 1;
      lVar25 = lVar25 + 0x20;
    } while (uVar26 != uVar15);
  }
  uVar20 = uVar2 >> 1 & 1;
  if ((uVar20 != 0) && (0 < (int)uVar17)) {
    pauVar18 = (undefined1 (*) [16])
               ((long)(int)uVar15 * local_e8 * local_128._16_8_ + local_128._0_8_);
    uVar26 = 0;
    do {
      if (0 < iVar24) {
        pauVar30 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 +
                   (uVar39 & 0xfffffffffffffffc) * 8);
        iVar34 = iVar24;
        do {
          *pauVar18 = *pauVar30;
          pauVar18 = pauVar18 + 1;
          pauVar30 = (undefined1 (*) [16])(*pauVar30 + uVar39 * 8);
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar19);
  }
  iVar34 = (int)(uVar39 & 0xfffffffffffffffc) + uVar20 * 2;
  if (iVar34 < (int)uVar2) {
    uVar26 = (ulong)iVar34;
    pvVar21 = (void *)(uVar26 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar17) {
        iVar16 = (int)uVar26;
        iVar34 = iVar16 + 3;
        if (-1 < iVar16) {
          iVar34 = iVar16;
        }
        puVar27 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar26 - ((byte)iVar34 & 0xfc)) / '\x02') +
                              (iVar34 >> 2) +
                              (iVar16 - (((uint)(uVar26 >> 0x1f) & 1) + iVar16 & 0xfffffffe))) *
                   local_e8 * local_128._16_8_ + local_128._0_8_);
        uVar29 = 0;
        do {
          if (0 < iVar24) {
            puVar31 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + (long)pvVar21);
            iVar34 = iVar24;
            do {
              *puVar27 = *puVar31;
              puVar27 = puVar27 + 1;
              puVar31 = puVar31 + uVar39;
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar19);
      }
      uVar26 = uVar26 + 1;
      pvVar21 = (void *)((long)pvVar21 + 8);
    } while (uVar26 != uVar39);
  }
  uVar15 = (int)local_c8 >> 2;
  if (0 < (int)uVar15) {
    local_a8 = local_d8->data;
    local_b0 = local_d8->elemsize * local_d8->cstep;
    lVar25 = local_128._16_8_ * local_e8;
    pvVar21 = local_d0->data;
    local_b8 = local_d0->elemsize * local_d0->cstep;
    iVar34 = uVar17 * iVar24;
    local_c0 = (ulong)uVar15;
    uVar19 = 0;
    do {
      local_a0 = uVar19;
      puVar38 = (undefined4 *)(local_a0 * 4 * local_b0 + (long)local_a8);
      puVar40 = (undefined4 *)((local_a0 * 4 + 1) * local_b0 + (long)local_a8);
      puVar23 = (undefined4 *)((local_a0 * 4 + 2) * local_b0 + (long)local_a8);
      puVar33 = (undefined4 *)((local_a0 * 4 + 3) * local_b0 + (long)local_a8);
      if ((int)uVar2 < 4) {
        uVar19 = 0;
      }
      else {
        uVar26 = 0;
        pvVar22 = (void *)local_128._0_8_;
        do {
          if (iVar34 < 1) {
            auVar56 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar58 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar60 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar47 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar45 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            lVar37 = 0;
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
            iVar16 = iVar34;
            do {
              local_98 = auVar61._0_32_;
              local_78 = auVar59._0_32_;
              local_58 = auVar57._0_32_;
              auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar22 + lVar37));
              auVar47 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37));
              auVar8 = vpmullw_avx2(auVar47,auVar51);
              auVar58 = vpmulhw_avx2(auVar51,auVar47);
              auVar45 = vpermq_avx2(auVar51,0x4e);
              auVar9 = vpmullw_avx2(auVar45,auVar47);
              auVar56 = vpmulhw_avx2(auVar45,auVar47);
              auVar44 = vpunpcklwd_avx2(auVar8,auVar58);
              auVar44 = vpaddd_avx2(auVar44,auVar54._0_32_);
              auVar48 = vpunpcklwd_avx2(auVar9,auVar56);
              auVar48 = vpaddd_avx2(auVar48,auVar55._0_32_);
              auVar60 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37 + 0x10));
              auVar10 = vpmullw_avx2(auVar60,auVar51);
              auVar6 = vpmulhw_avx2(auVar51,auVar60);
              auVar51 = vpunpcklwd_avx2(auVar10,auVar6);
              auVar51 = vpaddd_avx2(auVar52._0_32_,auVar51);
              auVar11 = vpmullw_avx2(auVar45,auVar60);
              auVar7 = vpmulhw_avx2(auVar45,auVar60);
              auVar45 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar45 = vpaddd_avx2(auVar50._0_32_,auVar45);
              auVar58 = vpunpckhwd_avx2(auVar8,auVar58);
              auVar44 = vpaddd_avx2(auVar44,auVar58);
              auVar54 = ZEXT3264(auVar44);
              auVar58 = vpunpckhwd_avx2(auVar9,auVar56);
              auVar48 = vpaddd_avx2(auVar48,auVar58);
              auVar55 = ZEXT3264(auVar48);
              auVar58 = vpunpckhwd_avx2(auVar10,auVar6);
              auVar51 = vpaddd_avx2(auVar51,auVar58);
              auVar52 = ZEXT3264(auVar51);
              auVar56 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar58 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar22 + lVar37 + 0x10));
              auVar45 = vpaddd_avx2(auVar45,auVar56);
              auVar50 = ZEXT3264(auVar45);
              auVar10 = vpmullw_avx2(auVar47,auVar58);
              auVar6 = vpmulhw_avx2(auVar47,auVar58);
              auVar56 = vpermq_avx2(auVar58,0x4e);
              auVar11 = vpmullw_avx2(auVar56,auVar47);
              auVar7 = vpmulhw_avx2(auVar56,auVar47);
              auVar12 = vpmullw_avx2(auVar60,auVar58);
              auVar8 = vpmulhw_avx2(auVar60,auVar58);
              auVar13 = vpmullw_avx2(auVar56,auVar60);
              auVar9 = vpmulhw_avx2(auVar56,auVar60);
              auVar47 = vpunpcklwd_avx2(auVar10,auVar6);
              auVar47 = vpaddd_avx2(auVar47,auVar49._0_32_);
              auVar60 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar60 = vpaddd_avx2(auVar60,local_98);
              auVar58 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar58 = vpaddd_avx2(auVar58,local_78);
              auVar56 = vpunpcklwd_avx2(auVar13,auVar9);
              auVar56 = vpaddd_avx2(auVar56,local_58);
              auVar6 = vpunpckhwd_avx2(auVar10,auVar6);
              auVar47 = vpaddd_avx2(auVar47,auVar6);
              auVar49 = ZEXT3264(auVar47);
              auVar6 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar60 = vpaddd_avx2(auVar60,auVar6);
              auVar61 = ZEXT3264(auVar60);
              auVar6 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar58 = vpaddd_avx2(auVar58,auVar6);
              auVar59 = ZEXT3264(auVar58);
              auVar6 = vpunpckhwd_avx2(auVar13,auVar9);
              auVar56 = vpaddd_avx2(auVar56,auVar6);
              auVar57 = ZEXT3264(auVar56);
              lVar37 = lVar37 + 0x20;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          auVar6 = vpunpckldq_avx2(auVar44,auVar48);
          auVar7 = vpunpckldq_avx2(auVar51,auVar45);
          auVar48 = vpunpckhdq_avx2(auVar44,auVar48);
          auVar51 = vpunpckhdq_avx2(auVar51,auVar45);
          auVar45 = vpunpcklqdq_avx2(auVar6,auVar7);
          auVar44 = vpunpckhqdq_avx2(auVar6,auVar7);
          auVar44 = vpaddd_avx2(auVar45,auVar44);
          auVar45 = vpunpcklqdq_avx2(auVar48,auVar51);
          auVar48 = vpunpckhqdq_avx2(auVar48,auVar51);
          auVar48 = vpaddd_avx2(auVar48,auVar45);
          auVar44 = vpaddd_avx2(auVar44,auVar48);
          auVar48 = vpunpckldq_avx2(auVar47,auVar60);
          auVar6 = vpunpckldq_avx2(auVar58,auVar56);
          auVar51 = vpunpckhdq_avx2(auVar47,auVar60);
          auVar45 = vpunpckhdq_avx2(auVar58,auVar56);
          auVar47 = vpunpcklqdq_avx2(auVar48,auVar6);
          auVar48 = vpunpckhqdq_avx2(auVar48,auVar6);
          *puVar38 = auVar44._0_4_;
          *puVar40 = auVar44._20_4_;
          *puVar23 = auVar44._8_4_;
          *puVar33 = auVar44._28_4_;
          puVar38[1] = auVar44._4_4_;
          auVar48 = vpaddd_avx2(auVar47,auVar48);
          auVar47 = vpunpcklqdq_avx2(auVar51,auVar45);
          auVar51 = vpunpckhqdq_avx2(auVar51,auVar45);
          puVar40[1] = auVar44._16_4_;
          puVar23[1] = auVar44._12_4_;
          puVar33[1] = auVar44._24_4_;
          auVar44 = vpaddd_avx2(auVar51,auVar47);
          auVar44 = vpaddd_avx2(auVar48,auVar44);
          puVar38[2] = auVar44._0_4_;
          puVar40[2] = auVar44._20_4_;
          puVar23[2] = auVar44._8_4_;
          puVar33[2] = auVar44._28_4_;
          puVar38[3] = auVar44._4_4_;
          puVar40[3] = auVar44._16_4_;
          puVar23[3] = auVar44._12_4_;
          puVar33[3] = auVar44._24_4_;
          puVar38 = puVar38 + 4;
          puVar40 = puVar40 + 4;
          puVar23 = puVar23 + 4;
          puVar33 = puVar33 + 4;
          uVar19 = uVar26 + 4;
          lVar37 = uVar26 + 7;
          pvVar22 = (void *)((long)pvVar22 + lVar25);
          uVar26 = uVar19;
        } while (lVar37 < (long)uVar39);
      }
      uVar15 = (uint)uVar19;
      if ((int)(uVar15 | 1) < (int)uVar2) {
        uVar20 = 0;
        do {
          iVar16 = (int)uVar19;
          if (iVar34 < 1) {
            auVar45 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            lVar37 = 0;
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar35 = iVar34;
            do {
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_128._0_8_ +
                                        lVar37 + (ulong)((uVar20 & 1) +
                                                        ((uint)(uVar19 >> 2) & 0x3fffffff)) * lVar25
                                        ));
              auVar48 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37 * 2));
              auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37 * 2 + 0x10));
              auVar6 = vpmullw_avx2(auVar48,auVar44);
              auVar47 = vpmulhw_avx2(auVar44,auVar48);
              auVar45 = vpermq_avx2(auVar44,0x4e);
              auVar7 = vpmullw_avx2(auVar45,auVar48);
              auVar60 = vpmulhw_avx2(auVar45,auVar48);
              auVar8 = vpmullw_avx2(auVar51,auVar44);
              auVar58 = vpmulhw_avx2(auVar44,auVar51);
              auVar9 = vpmullw_avx2(auVar45,auVar51);
              auVar56 = vpmulhw_avx2(auVar45,auVar51);
              auVar44 = vpunpcklwd_avx2(auVar6,auVar47);
              auVar44 = vpaddd_avx2(auVar44,auVar49._0_32_);
              auVar48 = vpunpcklwd_avx2(auVar7,auVar60);
              auVar48 = vpaddd_avx2(auVar48,auVar54._0_32_);
              auVar51 = vpunpcklwd_avx2(auVar8,auVar58);
              auVar51 = vpaddd_avx2(auVar51,auVar52._0_32_);
              auVar45 = vpunpcklwd_avx2(auVar9,auVar56);
              auVar45 = vpaddd_avx2(auVar45,auVar50._0_32_);
              auVar47 = vpunpckhwd_avx2(auVar6,auVar47);
              auVar44 = vpaddd_avx2(auVar44,auVar47);
              auVar49 = ZEXT3264(auVar44);
              auVar47 = vpunpckhwd_avx2(auVar7,auVar60);
              auVar48 = vpaddd_avx2(auVar48,auVar47);
              auVar54 = ZEXT3264(auVar48);
              auVar47 = vpunpckhwd_avx2(auVar8,auVar58);
              auVar51 = vpaddd_avx2(auVar51,auVar47);
              auVar52 = ZEXT3264(auVar51);
              auVar47 = vpunpckhwd_avx2(auVar9,auVar56);
              auVar45 = vpaddd_avx2(auVar45,auVar47);
              auVar50 = ZEXT3264(auVar45);
              lVar37 = lVar37 + 0x10;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          auVar47 = vpunpckldq_avx2(auVar44,auVar48);
          auVar60 = vpunpckldq_avx2(auVar51,auVar45);
          auVar48 = vpunpckhdq_avx2(auVar44,auVar48);
          auVar51 = vpunpckhdq_avx2(auVar51,auVar45);
          auVar45 = vpunpcklqdq_avx2(auVar47,auVar60);
          auVar44 = vpunpckhqdq_avx2(auVar47,auVar60);
          auVar44 = vpaddd_avx2(auVar45,auVar44);
          auVar45 = vpunpcklqdq_avx2(auVar48,auVar51);
          auVar48 = vpunpckhqdq_avx2(auVar48,auVar51);
          auVar48 = vpaddd_avx2(auVar48,auVar45);
          auVar44 = vpaddd_avx2(auVar44,auVar48);
          *puVar38 = auVar44._0_4_;
          *puVar40 = auVar44._20_4_;
          *puVar23 = auVar44._8_4_;
          *puVar33 = auVar44._28_4_;
          puVar38[1] = auVar44._4_4_;
          puVar40[1] = auVar44._16_4_;
          puVar23[1] = auVar44._12_4_;
          puVar33[1] = auVar44._24_4_;
          puVar38 = puVar38 + 2;
          puVar40 = puVar40 + 2;
          puVar23 = puVar23 + 2;
          puVar33 = puVar33 + 2;
          uVar15 = iVar16 + 2;
          uVar20 = (uint)(byte)((char)uVar20 + 1);
          uVar19 = (ulong)uVar15;
        } while (iVar16 + 3 < (int)uVar2);
      }
      if ((int)uVar15 < (int)uVar2) {
        do {
          if (iVar34 < 1) {
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            lVar37 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            iVar16 = iVar34;
            do {
              auVar43._8_8_ = 0;
              auVar43._0_8_ =
                   *(ulong *)(local_128._0_8_ +
                             lVar37 + (ulong)((uVar15 & 1) + (uVar15 >> 2) +
                                             (uint)((uVar15 >> 1 & 1) != 0)) * lVar25);
              auVar43 = vpmovsxbw_avx(auVar43);
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37 * 4));
              auVar48 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar21 + lVar37 * 4 + 0x10));
              auVar45._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar43;
              auVar45._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43
              ;
              auVar47 = vpmullw_avx2(auVar45,auVar44);
              auVar51 = vpmulhw_avx2(auVar45,auVar44);
              auVar60 = vpmullw_avx2(auVar45,auVar48);
              auVar45 = vpmulhw_avx2(auVar45,auVar48);
              auVar44 = vpunpcklwd_avx2(auVar47,auVar51);
              auVar44 = vpaddd_avx2(auVar49._0_32_,auVar44);
              auVar48 = vpunpcklwd_avx2(auVar60,auVar45);
              auVar48 = vpaddd_avx2(auVar50._0_32_,auVar48);
              auVar51 = vpunpckhwd_avx2(auVar47,auVar51);
              auVar44 = vpaddd_avx2(auVar44,auVar51);
              auVar49 = ZEXT3264(auVar44);
              auVar51 = vpunpckhwd_avx2(auVar60,auVar45);
              auVar48 = vpaddd_avx2(auVar48,auVar51);
              auVar50 = ZEXT3264(auVar48);
              lVar37 = lVar37 + 8;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          auVar43 = vpunpckldq_avx(auVar44._0_16_,auVar44._16_16_);
          auVar46 = vpunpckldq_avx(auVar48._0_16_,auVar48._16_16_);
          auVar53 = vpunpckhdq_avx(auVar44._0_16_,auVar44._16_16_);
          auVar42 = vpunpckhdq_avx(auVar48._0_16_,auVar48._16_16_);
          auVar5 = vpunpcklqdq_avx(auVar43,auVar46);
          auVar43 = vpunpckhqdq_avx(auVar43,auVar46);
          auVar43 = vpaddd_avx(auVar5,auVar43);
          auVar46 = vpunpcklqdq_avx(auVar53,auVar42);
          auVar53 = vpunpckhqdq_avx(auVar53,auVar42);
          auVar53 = vpaddd_avx(auVar53,auVar46);
          auVar43 = vpaddd_avx(auVar43,auVar53);
          *puVar38 = auVar43._0_4_;
          *puVar40 = auVar43._4_4_;
          *puVar23 = auVar43._8_4_;
          *puVar33 = auVar43._12_4_;
          puVar38 = puVar38 + 1;
          puVar40 = puVar40 + 1;
          puVar23 = puVar23 + 1;
          puVar33 = puVar33 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar2);
      }
      pvVar21 = (void *)((long)pvVar21 + local_b8);
      uVar19 = local_a0 + 1;
    } while (local_a0 + 1 != local_c0);
  }
  uVar19 = local_c8 & 0xfffffffffffffffc;
  if ((int)uVar19 != (int)local_c8) {
    pvVar21 = local_d8->data;
    sVar3 = local_d8->elemsize;
    sVar4 = local_d8->cstep;
    lVar25 = local_128._16_8_ * local_e8;
    pvVar22 = local_d0->data;
    lVar37 = local_d0->elemsize * local_d0->cstep;
    iVar24 = iVar24 * uVar17;
    do {
      pauVar18 = (undefined1 (*) [16])(sVar3 * sVar4 * uVar19 + (long)pvVar21);
      uVar17 = (uint)uVar19;
      if ((int)uVar2 < 4) {
        uVar26 = 0;
      }
      else {
        uVar15 = uVar17 + 3;
        if (-1 < (int)uVar17) {
          uVar15 = uVar17;
        }
        uVar29 = 0;
        do {
          if (iVar24 < 1) {
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar30 = (undefined1 (*) [16])((uVar29 >> 2) * lVar25 + local_128._0_8_);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            lVar41 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar44 = vpmovsxbw_avx2(*pauVar30);
              auVar48 = vpmovsxbw_avx2(pauVar30[1]);
              auVar53._8_8_ = 0;
              auVar53._0_8_ =
                   *(ulong *)((long)pvVar22 +
                             lVar41 * 8 +
                             (int)(((int)uVar15 >> 2) + (uVar17 - (uVar15 & 0xfffffffc))) * lVar37);
              auVar51 = vpmovsxbw_avx2(auVar53);
              auVar45 = vpermq_avx2(auVar51,0x44);
              auVar47 = vpmullw_avx2(auVar45,auVar44);
              auVar51 = vpmulhw_avx2(auVar44,auVar45);
              auVar60 = vpmullw_avx2(auVar45,auVar48);
              auVar45 = vpmulhw_avx2(auVar48,auVar45);
              auVar44 = vpunpcklwd_avx2(auVar47,auVar51);
              auVar44 = vpaddd_avx2(auVar54._0_32_,auVar44);
              auVar54 = ZEXT3264(auVar44);
              auVar48 = vpunpckhwd_avx2(auVar47,auVar51);
              auVar48 = vpaddd_avx2(auVar52._0_32_,auVar48);
              auVar52 = ZEXT3264(auVar48);
              auVar51 = vpunpcklwd_avx2(auVar60,auVar45);
              auVar51 = vpaddd_avx2(auVar50._0_32_,auVar51);
              auVar50 = ZEXT3264(auVar51);
              auVar45 = vpunpckhwd_avx2(auVar60,auVar45);
              auVar45 = vpaddd_avx2(auVar49._0_32_,auVar45);
              auVar49 = ZEXT3264(auVar45);
              lVar41 = lVar41 + 1;
              pauVar30 = pauVar30 + 2;
            } while (iVar24 != (int)lVar41);
            auVar44 = vpaddd_avx2(auVar48,auVar44);
            auVar48 = vpaddd_avx2(auVar45,auVar51);
          }
          auVar43 = vpshufd_avx(auVar44._0_16_,0xee);
          auVar43 = vpaddd_avx(auVar43,auVar44._0_16_);
          auVar53 = vpshufd_avx(auVar44._16_16_,0xee);
          auVar53 = vpaddd_avx(auVar53,auVar44._16_16_);
          auVar53 = vphaddd_avx(auVar43,auVar53);
          auVar43 = vpshufd_avx(auVar48._0_16_,0xee);
          auVar43 = vpaddd_avx(auVar43,auVar48._0_16_);
          auVar42 = vphaddd_avx(auVar43,auVar43);
          auVar43 = vpshufd_avx(auVar48._16_16_,0xee);
          auVar43 = vpaddd_avx(auVar43,auVar48._16_16_);
          auVar43 = vphaddd_avx(auVar43,auVar43);
          auVar53 = vpshufd_avx(auVar53,0xe8);
          auVar53 = vpunpcklqdq_avx(auVar53,auVar42);
          auVar42._0_4_ = auVar43._0_4_;
          auVar42._4_4_ = auVar42._0_4_;
          auVar42._8_4_ = auVar42._0_4_;
          auVar42._12_4_ = auVar42._0_4_;
          auVar43 = vpblendd_avx2(auVar53,auVar42,8);
          *pauVar18 = auVar43;
          pauVar18 = pauVar18 + 1;
          uVar26 = uVar29 + 4;
          lVar41 = uVar29 + 7;
          uVar29 = uVar26;
        } while (lVar41 < (long)uVar39);
      }
      uVar15 = (uint)uVar26;
      if ((int)(uVar15 | 1) < (int)uVar2) {
        uVar20 = uVar17 + 3;
        if (-1 < (int)uVar17) {
          uVar20 = uVar17;
        }
        do {
          uVar36 = (uint)uVar26;
          if (iVar24 < 1) {
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar30 = (undefined1 (*) [16])
                       ((ulong)(((uint)(uVar26 >> 2) & 0x3fffffff) + (uint)((uVar36 >> 1 & 1) != 0))
                        * lVar25 + local_128._0_8_);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            lVar41 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar44 = vpmovsxbw_avx2(*pauVar30);
              auVar46._8_8_ = 0;
              auVar46._0_8_ =
                   *(ulong *)((long)pvVar22 +
                             lVar41 * 8 +
                             (int)(((int)uVar20 >> 2) + (uVar17 - (uVar20 & 0xfffffffc))) * lVar37);
              auVar48 = vpmovsxbw_avx2(auVar46);
              auVar48 = vpermq_avx2(auVar48,0x44);
              auVar51 = vpmullw_avx2(auVar48,auVar44);
              auVar48 = vpmulhw_avx2(auVar44,auVar48);
              auVar44 = vpunpcklwd_avx2(auVar51,auVar48);
              auVar44 = vpaddd_avx2(auVar50._0_32_,auVar44);
              auVar50 = ZEXT3264(auVar44);
              auVar48 = vpunpckhwd_avx2(auVar51,auVar48);
              auVar48 = vpaddd_avx2(auVar49._0_32_,auVar48);
              auVar49 = ZEXT3264(auVar48);
              pauVar30 = pauVar30 + 1;
              lVar41 = lVar41 + 1;
            } while (iVar24 != (int)lVar41);
            auVar44 = vpaddd_avx2(auVar48,auVar44);
          }
          auVar43 = vpshufd_avx(auVar44._0_16_,0xee);
          auVar43 = vpaddd_avx(auVar43,auVar44._0_16_);
          auVar53 = vpshufd_avx(auVar44._16_16_,0xee);
          auVar53 = vpaddd_avx(auVar53,auVar44._16_16_);
          auVar43 = vphaddd_avx(auVar43,auVar53);
          auVar43 = vpshufd_avx(auVar43,0xe8);
          *(long *)*pauVar18 = auVar43._0_8_;
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + 8);
          uVar15 = uVar36 + 2;
          uVar26 = (ulong)uVar15;
        } while ((int)(uVar36 + 3) < (int)uVar2);
      }
      if ((int)uVar15 < (int)uVar2) {
        uVar20 = uVar17 + 3;
        if (-1 < (int)uVar17) {
          uVar20 = uVar17;
        }
        do {
          if (iVar24 < 1) {
            auVar43 = (undefined1  [16])0x0;
          }
          else {
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            lVar41 = 0;
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_128._0_8_ +
                                       lVar41 * 8 +
                                       (ulong)((uVar15 & 1) + (uVar15 >> 2) +
                                              (uint)((uVar15 >> 1 & 1) != 0)) * lVar25);
              auVar43 = vpmovsxbw_avx(auVar5);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar22 +
                                       lVar41 * 8 +
                                       (int)(((int)uVar20 >> 2) + (uVar17 - (uVar20 & 0xfffffffc)))
                                       * lVar37);
              auVar53 = vpmovsxbw_avx(auVar1);
              auVar42 = vpmullw_avx(auVar53,auVar43);
              auVar53 = vpmulhw_avx(auVar43,auVar53);
              auVar43 = vpunpcklwd_avx(auVar42,auVar53);
              auVar43 = vpaddd_avx(auVar50._0_16_,auVar43);
              auVar50 = ZEXT1664(auVar43);
              auVar53 = vpunpckhwd_avx(auVar42,auVar53);
              auVar53 = vpaddd_avx(auVar49._0_16_,auVar53);
              auVar49 = ZEXT1664(auVar53);
              lVar41 = lVar41 + 1;
            } while (iVar24 != (int)lVar41);
            auVar43 = vpaddd_avx(auVar53,auVar43);
          }
          auVar43 = vphaddd_avx(auVar43,auVar43);
          auVar43 = vphaddd_avx(auVar43,auVar43);
          *(int *)*pauVar18 = auVar43._0_4_;
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + 4);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar2);
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)local_c8);
  }
  piVar14 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
        if ((void *)local_128._0_8_ != (void *)0x0) {
          free((void *)local_128._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_128._32_8_ + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}